

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3gau_io.c
# Opt level: O0

int s3gaudnom_read(char *fn,float32 ****out_dnom,uint32 *out_n_cb,uint32 *out_n_feat,
                  uint32 *out_n_density)

{
  int iVar1;
  int32 iVar2;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  uint32 *chksum;
  undefined4 uVar4;
  uint32 local_64;
  FILE *pFStack_60;
  uint32 swap;
  FILE *fp;
  char *do_chk;
  char *ver;
  uint32 local_40;
  uint32 ignore;
  uint32 sv_chksum;
  uint32 rd_chksum;
  uint32 *out_n_density_local;
  uint32 *out_n_feat_local;
  uint32 *out_n_cb_local;
  float32 ****out_dnom_local;
  char *fn_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  ignore = 0;
  _sv_chksum = out_n_density;
  out_n_density_local = out_n_feat;
  out_n_feat_local = out_n_cb;
  out_n_cb_local = (uint32 *)out_dnom;
  out_dnom_local = (float32 ****)fn;
  pFStack_60 = s3open(fn,"rb",&local_64);
  if (pFStack_60 == (FILE *)0x0) {
    fn_local._4_4_ = -1;
  }
  else {
    do_chk = s3get_gvn_fattr("version");
    if (do_chk == (char *)0x0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
              ,0x206,"No version attribute for %s\n",out_dnom_local);
      exit(1);
    }
    iVar1 = strcmp(do_chk,"1.0");
    if (iVar1 != 0) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
              ,0x202,"Version mismatch for %s, file ver: %s != reader ver: %s\n",out_dnom_local,
              do_chk,"1.0");
      exit(1);
    }
    fp = (FILE *)s3get_gvn_fattr("chksum0");
    chksum = &ignore;
    iVar2 = bio_fread_3d((void ****)out_n_cb_local,4,out_n_feat_local,out_n_density_local,_sv_chksum
                         ,pFStack_60,local_64,chksum);
    uVar4 = (undefined4)((ulong)chksum >> 0x20);
    if (iVar2 < 0) {
      s3close(pFStack_60);
      fn_local._4_4_ = -1;
    }
    else {
      if (fp != (FILE *)0x0) {
        iVar2 = bio_fread(&local_40,4,1,pFStack_60,local_64,(uint32 *)((long)&ver + 4));
        if (iVar2 != 1) {
          s3close(pFStack_60);
          return -1;
        }
        if (local_40 != ignore) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
                  ,0x222,"Checksum error; read corrupt data.\n");
          exit(1);
        }
      }
      s3close(pFStack_60);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3gau_io.c"
              ,0x229,"Read %s [%ux%ux%u array]\n",out_dnom_local,(ulong)*out_n_feat_local,
              CONCAT44(uVar3,*out_n_density_local),CONCAT44(uVar4,*_sv_chksum));
      fn_local._4_4_ = 0;
    }
  }
  return fn_local._4_4_;
}

Assistant:

int
s3gaudnom_read(const char *fn,
	       float32 ****out_dnom,
	       uint32 *out_n_cb,
	       uint32 *out_n_feat,
	       uint32 *out_n_density)
{
    uint32 rd_chksum = 0;
    uint32 sv_chksum;
    uint32 ignore;
    char *ver;
    char *do_chk;
    FILE *fp;
    uint32 swap;

    fp = s3open(fn, "rb", &swap);
    if (fp == NULL)
	return S3_ERROR;

    /* check version id */
    ver = s3get_gvn_fattr("version");
    if (ver) {
	if (strcmp(ver, GAUDNOM_FILE_VERSION) != 0) {
	    E_FATAL("Version mismatch for %s, file ver: %s != reader ver: %s\n",
		    fn, ver, GAUDNOM_FILE_VERSION);
	}
    }
    else {
	E_FATAL("No version attribute for %s\n", fn);
    }
    
    /* if do_chk is non-NULL, there is a checksum after the data in the file */
    do_chk = s3get_gvn_fattr("chksum0");

    /* Read the mixing weight array */
    if (bio_fread_3d((void ****)out_dnom,
		  sizeof(float32),
		  out_n_cb,
		  out_n_feat,
		  out_n_density,
		  fp,
		  swap, &rd_chksum) < 0) {
	s3close(fp);
	return S3_ERROR;
    }

    if (do_chk) {
	/* See if the checksum in the file matches that which
	   was computed from the read data */

	if (bio_fread(&sv_chksum, sizeof(uint32), 1, fp, swap, &ignore) != 1) {
	    s3close(fp);
	    return S3_ERROR;
	}

	if (sv_chksum != rd_chksum) {
	    E_FATAL("Checksum error; read corrupt data.\n");
	}
    }

    s3close(fp);

    E_INFO("Read %s [%ux%ux%u array]\n",
	   fn, *out_n_cb, *out_n_feat, *out_n_density);

    return S3_SUCCESS;
}